

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O0

EulerAngles *
AML::smoothInterpolate
          (EulerAngles *__return_storage_ptr__,EulerAngles *startAngles,EulerAngles *endAngles,
          double t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined4 uVar4;
  EulerSequence EVar5;
  EulerSequence EVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double psiNew;
  double thetaNew;
  double phiNew;
  double deltaPsi;
  double deltaTheta;
  double deltaPhi;
  double t5;
  double t4;
  double t3;
  double t2;
  double t_local;
  EulerAngles *endAngles_local;
  EulerAngles *startAngles_local;
  
  EVar5 = EulerAngles::getEulerSequence(startAngles);
  EVar6 = EulerAngles::getEulerSequence(endAngles);
  if (EVar5 == EVar6) {
    if (0.0 <= t) {
      if (t <= 1.0) {
        dVar7 = t * t * t;
        dVar8 = dVar7 * t;
        dVar9 = dVar8 * t;
        dVar10 = endAngles->phi - startAngles->phi;
        dVar11 = endAngles->theta - startAngles->theta;
        dVar12 = endAngles->psi - startAngles->psi;
        dVar1 = startAngles->phi;
        dVar2 = startAngles->theta;
        dVar3 = startAngles->psi;
        EVar5 = EulerAngles::getEulerSequence(startAngles);
        EulerAngles::EulerAngles
                  (__return_storage_ptr__,
                   dVar10 * 10.0 * dVar7 + dVar10 * 6.0 * dVar9 + dVar10 * -15.0 * dVar8 + dVar1,
                   dVar11 * 10.0 * dVar7 + dVar11 * 6.0 * dVar9 + dVar11 * -15.0 * dVar8 + dVar2,
                   dVar12 * 10.0 * dVar7 + dVar12 * 6.0 * dVar9 + dVar12 * -15.0 * dVar8 + dVar3,
                   EVar5);
      }
      else {
        __return_storage_ptr__->phi = endAngles->phi;
        __return_storage_ptr__->theta = endAngles->theta;
        __return_storage_ptr__->psi = endAngles->psi;
        uVar4 = *(undefined4 *)&endAngles->field_0x1c;
        __return_storage_ptr__->seq_ = endAngles->seq_;
        *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar4;
      }
    }
    else {
      __return_storage_ptr__->phi = startAngles->phi;
      __return_storage_ptr__->theta = startAngles->theta;
      __return_storage_ptr__->psi = startAngles->psi;
      uVar4 = *(undefined4 *)&startAngles->field_0x1c;
      __return_storage_ptr__->seq_ = startAngles->seq_;
      *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar4;
    }
  }
  else {
    EulerAngles::EulerAngles(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

EulerAngles smoothInterpolate(const EulerAngles& startAngles, const EulerAngles& endAngles, double t)
    {
        if (startAngles.getEulerSequence() == endAngles.getEulerSequence())
        {
            if (t < 0.0)
            {
                return startAngles;
            }
            if (t > 1.0)
            {
                return endAngles;
            }

            double t2 = t * t;
            double t3 = t2 * t;
            double t4 = t3 * t;
            double t5 = t4 * t;

            double deltaPhi = endAngles.phi - startAngles.phi;
            double deltaTheta = endAngles.theta - startAngles.theta;
            double deltaPsi = endAngles.psi - startAngles.psi;

            double phiNew = 6 * deltaPhi * t5 + -15 * deltaPhi * t4 + 10 * deltaPhi * t3 + startAngles.phi;
            double thetaNew = 6 * deltaTheta * t5 + -15 * deltaTheta * t4 + 10 * deltaTheta * t3 + startAngles.theta;
            double psiNew = 6 * deltaPsi * t5 + -15 * deltaPsi * t4 + 10 * deltaPsi * t3 + startAngles.psi;

            return EulerAngles(phiNew, thetaNew, psiNew, startAngles.getEulerSequence());
        }
        return EulerAngles();
    }